

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::ensurePolished(QWidget *this)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QArrayDataPointer<QObject_*> local_50;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  lVar3 = (*(code *)**(undefined8 **)this)();
  if (lVar3 != *(long *)(lVar1 + 0xc0)) {
    *(long *)(lVar1 + 0xc0) = lVar3;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_38,Polish);
    QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_38);
    local_50.d = *(Data **)(lVar1 + 0x18);
    local_50.ptr = *(QObject ***)(lVar1 + 0x20);
    uVar2 = *(ulong *)(lVar1 + 0x28);
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_50.size = uVar2;
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      if ((*(byte *)(*(long *)&((QWidget *)local_50.ptr[uVar4])->field_0x8 + 0x30) & 1) != 0) {
        ensurePolished((QWidget *)local_50.ptr[uVar4]);
      }
    }
    if ((*(long *)(lVar1 + 0x10) != 0) && ((*(byte *)(lVar1 + 0x30) & 0x10) != 0)) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      QChildEvent::QChildEvent((QChildEvent *)&local_68,ChildPolished,&this->super_QObject);
      QCoreApplication::sendEvent(*(QObject **)(lVar1 + 0x10),(QEvent *)&local_68);
      QChildEvent::~QChildEvent((QChildEvent *)&local_68);
    }
    QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_50);
    QEvent::~QEvent((QEvent *)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::ensurePolished() const
{
    Q_D(const QWidget);

    const QMetaObject *m = metaObject();
    if (m == d->polished)
        return;
    d->polished = m;

    QEvent e(QEvent::Polish);
    QCoreApplication::sendEvent(const_cast<QWidget *>(this), &e);

    // polish children after 'this'
    QList<QObject*> children = d->children;
    for (int i = 0; i < children.size(); ++i) {
        QObject *o = children.at(i);
        if (!o->isWidgetType())
            continue;
        if (QWidget *w = qobject_cast<QWidget *>(o))
            w->ensurePolished();
    }

    if (d->parent && d->sendChildEvents) {
        QChildEvent e(QEvent::ChildPolished, const_cast<QWidget *>(this));
        QCoreApplication::sendEvent(d->parent, &e);
    }
}